

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O0

boolean decode_mcu_AC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  int iVar2;
  jpeg_entropy_decoder *pjVar3;
  int *piVar4;
  JBLOCKROW paJVar5;
  d_derived_tbl *htbl;
  short sVar6;
  boolean bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  JCOEF *pJVar11;
  long lVar12;
  int pos;
  int look;
  int nb;
  int newnz_pos [64];
  int num_newnz;
  d_derived_tbl *tbl;
  bitread_working_state br_state;
  _func_void_j_decompress_ptr *p_Stack_68;
  int bits_left;
  bit_buf_type get_buffer;
  JCOEFPTR thiscoef;
  JBLOCKROW block;
  int *natural_order;
  int m1;
  int p1;
  int Se;
  uint EOBRUN;
  int r;
  int k;
  int s;
  huff_entropy_ptr entropy;
  JBLOCKROW *MCU_data_local;
  j_decompress_ptr cinfo_local;
  
  pjVar3 = cinfo->entropy;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar3[3].decode_mcu != 0)) ||
     (bVar7 = process_restart(cinfo), bVar7 != 0)) {
    if (*(int *)((long)&pjVar3[3].start_pass + 4) == 0) {
      iVar1 = cinfo->Se;
      uVar8 = 1 << ((byte)cinfo->Al & 0x1f);
      iVar9 = -1 << ((byte)cinfo->Al & 0x1f);
      piVar4 = cinfo->natural_order;
      tbl = (d_derived_tbl *)cinfo->src->next_input_byte;
      br_state.next_input_byte = (JOCTET *)cinfo->src->bytes_in_buffer;
      p_Stack_68 = pjVar3[1].start_pass;
      br_state.cinfo._4_4_ = *(int *)&pjVar3[1].decode_mcu;
      p1 = *(int *)&pjVar3[2].start_pass;
      paJVar5 = *MCU_data;
      htbl = (d_derived_tbl *)pjVar3[6].start_pass;
      newnz_pos[0x3f] = 0;
      EOBRUN = cinfo->Ss;
      sVar6 = (short)iVar9;
      br_state._24_8_ = cinfo;
      if (p1 == 0) {
        for (; (int)EOBRUN <= iVar1; EOBRUN = EOBRUN + 1) {
          if (br_state.cinfo._4_4_ < 8) {
            bVar7 = jpeg_fill_bit_buffer
                              ((bitread_working_state *)&tbl,(bit_buf_type)p_Stack_68,
                               br_state.cinfo._4_4_,0);
            if (bVar7 == 0) goto LAB_0039aac1;
            p_Stack_68 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
            br_state.cinfo._4_4_ = (int)br_state.get_buffer;
            if (7 < (int)br_state.get_buffer) goto LAB_0039a656;
            pos = 1;
LAB_0039a6c4:
            r = jpeg_huff_decode((bitread_working_state *)&tbl,(bit_buf_type)p_Stack_68,
                                 br_state.cinfo._4_4_,htbl,pos);
            if (r < 0) goto LAB_0039aac1;
            p_Stack_68 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
            br_state.cinfo._4_4_ = (int)br_state.get_buffer;
          }
          else {
LAB_0039a656:
            uVar10 = (uint)((long)p_Stack_68 >> ((char)br_state.cinfo._4_4_ - 8U & 0x3f)) & 0xff;
            if (htbl->look_nbits[(int)uVar10] == 0) {
              pos = 9;
              goto LAB_0039a6c4;
            }
            br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - htbl->look_nbits[(int)uVar10];
            r = (int)htbl->look_sym[(int)uVar10];
          }
          Se = r >> 4;
          if ((r & 0xfU) == 0) {
            if (Se != 0xf) {
              p1 = 1 << ((byte)Se & 0x1f);
              if (Se != 0) {
                if (br_state.cinfo._4_4_ < Se) {
                  bVar7 = jpeg_fill_bit_buffer
                                    ((bitread_working_state *)&tbl,(bit_buf_type)p_Stack_68,
                                     br_state.cinfo._4_4_,Se);
                  if (bVar7 == 0) goto LAB_0039aac1;
                  p_Stack_68 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
                  br_state.cinfo._4_4_ = (int)br_state.get_buffer;
                }
                br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - Se;
                p1 = ((uint)((long)p_Stack_68 >> ((byte)br_state.cinfo._4_4_ & 0x3f)) & bmask[Se]) +
                     p1;
              }
              break;
            }
            r = 0;
          }
          else {
            if ((r & 0xfU) != 1) {
              cinfo->err->msg_code = 0x79;
              (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
            }
            if (br_state.cinfo._4_4_ < 1) {
              bVar7 = jpeg_fill_bit_buffer
                                ((bitread_working_state *)&tbl,(bit_buf_type)p_Stack_68,
                                 br_state.cinfo._4_4_,1);
              if (bVar7 == 0) goto LAB_0039aac1;
              p_Stack_68 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
              br_state.cinfo._4_4_ = (int)br_state.get_buffer;
            }
            br_state.cinfo._4_4_ = br_state.cinfo._4_4_ + -1;
            r = iVar9;
            if (((long)p_Stack_68 >> ((byte)br_state.cinfo._4_4_ & 0x3f) & (ulong)1) != 0) {
              r = uVar8;
            }
          }
          do {
            pJVar11 = *paJVar5 + piVar4[(int)EOBRUN];
            if (*pJVar11 == 0) {
              Se = Se + -1;
              if (Se < 0) break;
            }
            else {
              if (br_state.cinfo._4_4_ < 1) {
                bVar7 = jpeg_fill_bit_buffer
                                  ((bitread_working_state *)&tbl,(bit_buf_type)p_Stack_68,
                                   br_state.cinfo._4_4_,1);
                if (bVar7 == 0) goto LAB_0039aac1;
                p_Stack_68 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
                br_state.cinfo._4_4_ = (int)br_state.get_buffer;
              }
              br_state.cinfo._4_4_ = br_state.cinfo._4_4_ + -1;
              if ((((long)p_Stack_68 >> ((byte)br_state.cinfo._4_4_ & 0x3f) & (ulong)1) != 0) &&
                 (((int)*pJVar11 & uVar8) == 0)) {
                if (*pJVar11 < 0) {
                  *pJVar11 = *pJVar11 + sVar6;
                }
                else {
                  *pJVar11 = *pJVar11 + (short)uVar8;
                }
              }
            }
            EOBRUN = EOBRUN + 1;
          } while ((int)EOBRUN <= iVar1);
          if (r != 0) {
            iVar2 = piVar4[(int)EOBRUN];
            (*paJVar5)[iVar2] = (JCOEF)r;
            lVar12 = (long)newnz_pos[0x3f];
            newnz_pos[0x3f] = newnz_pos[0x3f] + 1;
            (&look)[lVar12] = iVar2;
          }
        }
      }
      if (p1 != 0) {
        for (; (int)EOBRUN <= iVar1; EOBRUN = EOBRUN + 1) {
          pJVar11 = *paJVar5 + piVar4[(int)EOBRUN];
          if (*pJVar11 != 0) {
            if (br_state.cinfo._4_4_ < 1) {
              bVar7 = jpeg_fill_bit_buffer
                                ((bitread_working_state *)&tbl,(bit_buf_type)p_Stack_68,
                                 br_state.cinfo._4_4_,1);
              if (bVar7 == 0) {
LAB_0039aac1:
                while (0 < newnz_pos[0x3f]) {
                  newnz_pos[0x3f] = newnz_pos[0x3f] + -1;
                  (*paJVar5)[(&look)[newnz_pos[0x3f]]] = 0;
                }
                return 0;
              }
              p_Stack_68 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
              br_state.cinfo._4_4_ = (int)br_state.get_buffer;
            }
            br_state.cinfo._4_4_ = br_state.cinfo._4_4_ + -1;
            if ((((long)p_Stack_68 >> ((byte)br_state.cinfo._4_4_ & 0x3f) & (ulong)1) != 0) &&
               (((int)*pJVar11 & uVar8) == 0)) {
              if (*pJVar11 < 0) {
                *pJVar11 = *pJVar11 + sVar6;
              }
              else {
                *pJVar11 = *pJVar11 + (short)uVar8;
              }
            }
          }
        }
        p1 = p1 + -1;
      }
      cinfo->src->next_input_byte = (JOCTET *)tbl;
      cinfo->src->bytes_in_buffer = (size_t)br_state.next_input_byte;
      pjVar3[1].start_pass = p_Stack_68;
      *(int *)&pjVar3[1].decode_mcu = br_state.cinfo._4_4_;
      *(int *)&pjVar3[2].start_pass = p1;
    }
    *(int *)&pjVar3[3].decode_mcu = *(int *)&pjVar3[3].decode_mcu + -1;
    cinfo_local._4_4_ = 1;
  }
  else {
    cinfo_local._4_4_ = 0;
  }
  return cinfo_local._4_4_;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_refine (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  JCOEFPTR thiscoef;
  unsigned char *st;
  int tbl, k, kex;
  int p1, m1;
  const int * natural_order;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  natural_order = cinfo->natural_order;

  /* There is always only one block per MCU */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  p1 = 1 << cinfo->Al;		/* 1 in the bit position being coded */
  m1 = (-1) << cinfo->Al;	/* -1 in the bit position being coded */

  /* Establish EOBx (previous stage end-of-block) index */
  for (kex = cinfo->Se; kex > 0; kex--)
    if ((*block)[natural_order[kex]]) break;

  for (k = cinfo->Ss; k <= cinfo->Se; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (k > kex)
      if (arith_decode(cinfo, st)) break;	/* EOB flag */
    for (;;) {
      thiscoef = *block + natural_order[k];
      if (*thiscoef) {				/* previously nonzero coef */
	if (arith_decode(cinfo, st + 2)) {
	  if (*thiscoef < 0)
	    *thiscoef += m1;
	  else
	    *thiscoef += p1;
	}
	break;
      }
      if (arith_decode(cinfo, st + 1)) {	/* newly nonzero coef */
	if (arith_decode(cinfo, entropy->fixed_bin))
	  *thiscoef = m1;
	else
	  *thiscoef = p1;
	break;
      }
      st += 3; k++;
      if (k > cinfo->Se) {
	WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	entropy->ct = -1;			/* spectral overflow */
	return TRUE;
      }
    }
  }

  return TRUE;
}